

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O2

int rfc5444_reader_handle_packet(rfc5444_reader *parser,uint8_t *buffer,size_t length)

{
  rfc5444_reader_addrblock_entry *prVar1;
  uint uVar2;
  list_entity *binary;
  uint8_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  rfc5444_result rVar6;
  rfc5444_result rVar7;
  rfc5444_reader_addrblock_entry *prVar8;
  byte bVar9;
  list_entity *plVar10;
  rfc5444_reader_tlvblock_consumer *last;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  rfc5444_reader_tlvblock_consumer *first;
  rfc5444_reader_tlvblock_consumer *prVar15;
  byte bVar16;
  list_entity *plVar17;
  byte *pbVar18;
  ulong uVar19;
  byte *pbVar20;
  rfc5444_result local_19c;
  byte *local_198;
  byte *local_190;
  byte *local_188;
  rfc5444_reader_tlvblock_consumer *local_180;
  byte *local_178;
  rfc5444_result local_16c;
  ulong local_168;
  list_entity *local_160;
  rfc5444_reader_tlvblock_consumer *local_158;
  list_entity addr_head;
  rfc5444_reader_tlvblock_context local_120;
  rfc5444_reader_tlvblock_consumer *local_88;
  avl_tree entries;
  avl_tree tlv_entries;
  
  local_16c = RFC5444_OKAY;
  if (length < 0x10000) {
    rVar6 = RFC5444_OKAY;
    local_198 = buffer;
    memset(&local_120.consumer,0,0x90);
    if (length == 0) {
      local_16c = RFC5444_END_OF_BUFFER;
      rVar6 = RFC5444_END_OF_BUFFER;
      bVar16 = 0;
    }
    else {
      bVar16 = *buffer;
      local_198 = buffer + 1;
    }
    local_120.pkt_version = bVar16 >> 4;
    local_120.pkt_flags = bVar16 & 0xf;
    if (bVar16 < 0x10) {
      local_188 = buffer + length;
      local_120.has_pktseqno = (_Bool)(bVar16 >> 3);
      local_120.reader = parser;
      if (7 < bVar16) {
        local_120.pkt_seqno = _rfc5444_get_u16(&local_198,local_188,&local_16c);
        rVar6 = local_16c;
      }
      pbVar18 = local_188;
      if ((rVar6 == RFC5444_OKAY) &&
         ((avl_init(&entries,avl_comp_uint32,true), uVar3 = local_120.pkt_flags,
          (local_120.pkt_flags & 4) == 0 ||
          (rVar6 = _parse_tlvblock(parser,&entries,&local_198,pbVar18,'\0'), rVar6 == RFC5444_OKAY))
         )) {
        local_158 = (rfc5444_reader_tlvblock_consumer *)0x0;
        prVar15 = (rfc5444_reader_tlvblock_consumer *)parser;
        local_120.pkt_buffer = buffer;
        local_120.pkt_size = length;
        do {
          prVar15 = (rfc5444_reader_tlvblock_consumer *)(prVar15->_node).list.next;
          if ((prVar15->_node).list.prev == (parser->packet_consumer).list_head.prev) {
            local_16c = RFC5444_OKAY;
            local_88 = (rfc5444_reader_tlvblock_consumer *)&parser->message_consumer;
            pbVar18 = local_188;
            goto LAB_001149c5;
          }
        } while (((prVar15->start_callback ==
                   (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) ||
                 (local_120.consumer = prVar15, rVar7 = (*prVar15->start_callback)(&local_120),
                 rVar7 == RFC5444_OKAY)) &&
                ((local_158 = prVar15, (uVar3 & 4) == 0 ||
                 (((prVar15->tlv_callback ==
                    (_func_rfc5444_result_rfc5444_reader_tlvblock_entry_ptr_rfc5444_reader_tlvblock_context_ptr
                     *)0x0 &&
                   (prVar15->block_callback ==
                    (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0)) ||
                  (rVar7 = _schedule_tlvblock(prVar15,&local_120,&entries,'\0'), local_158 = prVar15
                  , rVar7 == RFC5444_OKAY))))));
LAB_00115321:
        if ((parser->packet_consumer).count != 0) {
          while ((prVar15->_node).list.next != (parser->packet_consumer).list_head.next) {
            if (prVar15->end_callback !=
                (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) {
              local_120.consumer = prVar15;
              (*prVar15->end_callback)(&local_120,rVar7 != RFC5444_OKAY);
            }
            prVar15 = (rfc5444_reader_tlvblock_consumer *)(prVar15->_node).list.prev;
          }
        }
        _free_tlvblock(parser,&entries);
        rVar6 = RFC5444_OKAY;
        if (rVar7 != RFC5444_DROP_PACKET) {
          rVar6 = rVar7;
        }
      }
    }
    else {
      rVar6 = RFC5444_UNSUPPORTED_VERSION;
    }
  }
  else {
    rVar6 = RFC5444_TOO_LARGE;
  }
  return rVar6;
LAB_001149c5:
  pbVar20 = local_198;
  prVar15 = local_158;
  rVar7 = local_16c;
  if ((local_16c == RFC5444_OKAY) && (local_198 < pbVar18)) {
    local_19c = RFC5444_OKAY;
    avl_init(&tlv_entries,avl_comp_uint16,true);
    addr_head.next = &addr_head;
    local_120._do_not_forward = false;
    local_120.msg_type = *pbVar20;
    local_198 = pbVar20 + 1;
    if (local_198 < pbVar18) {
      uVar11 = (ulong)pbVar20[1];
      local_198 = pbVar20 + 2;
    }
    else {
      local_19c = RFC5444_END_OF_BUFFER;
      uVar11 = 0;
    }
    addr_head.prev = addr_head.next;
    uVar5 = _rfc5444_get_u16(&local_198,pbVar18,&local_19c);
    pbVar14 = local_198;
    bVar16 = (byte)uVar11;
    local_120.addr_len = (bVar16 & 0xf) + 1;
    local_120.msg_flags = bVar16 & 0xf0;
    local_120.has_origaddr = SUB81(uVar11 >> 7,0);
    local_190 = pbVar20;
    if (-1 < (char)bVar16) {
LAB_00114ac8:
      pbVar20 = local_190;
      uVar2 = (uint)uVar11;
      local_120.has_hoplimit = SUB41((uVar2 & 0x40) >> 6,0);
      if ((uVar11 & 0x40) != 0) {
        if (local_19c == RFC5444_OKAY) {
          if (local_198 < pbVar18) {
            local_120.hoplimit = *local_198;
            local_198 = local_198 + 1;
            goto LAB_00114b0f;
          }
          local_19c = RFC5444_END_OF_BUFFER;
        }
        local_120.hoplimit = 0;
      }
LAB_00114b0f:
      local_120.has_hopcount = SUB41((uVar2 & 0x20) >> 5,0);
      if ((uVar11 & 0x20) != 0) {
        if (local_19c == RFC5444_OKAY) {
          if (local_198 < pbVar18) {
            local_120.hopcount = *local_198;
            local_198 = local_198 + 1;
            goto LAB_00114b52;
          }
          local_19c = RFC5444_END_OF_BUFFER;
        }
        local_120.hopcount = 0;
      }
LAB_00114b52:
      local_120.has_seqno = SUB41((uVar2 & 0x10) >> 4,0);
      if ((uVar11 & 0x10) != 0) {
        local_120.seqno = _rfc5444_get_u16(&local_198,pbVar18,&local_19c);
      }
      uVar11 = (ulong)uVar5;
      pbVar14 = pbVar20 + uVar11;
      if (pbVar18 < pbVar14) {
        local_19c = RFC5444_END_OF_BUFFER;
        local_198 = pbVar18;
        goto LAB_00114b99;
      }
      rVar6 = local_19c;
      if ((local_19c == RFC5444_OKAY) &&
         (rVar6 = _parse_tlvblock(parser,&tlv_entries,&local_198,pbVar14,'\0'), local_19c = rVar6,
         rVar6 == RFC5444_OKAY)) {
        local_19c = RFC5444_OKAY;
        local_178 = pbVar14;
        local_168 = uVar11;
LAB_00114bef:
        pbVar13 = local_198;
        if (local_178 <= local_198) goto LAB_00114ec1;
        prVar8 = (*parser->malloc_addrblock_entry)();
        if (prVar8 == (rfc5444_reader_addrblock_entry *)0x0) {
          local_19c = RFC5444_OUT_OF_MEMORY;
          pbVar14 = local_178;
          goto LAB_00114b99;
        }
        local_180 = (rfc5444_reader_tlvblock_consumer *)&prVar8->tlvblock;
        avl_init((avl_tree *)local_180,avl_comp_uint16,true);
        uVar3 = local_120.addr_len;
        pbVar14 = local_178;
        prVar8->addr_block_ptr = pbVar13;
        bVar16 = *pbVar13;
        local_198 = pbVar13 + 1;
        prVar8->num_addr = bVar16;
        pbVar20 = local_190;
        if (bVar16 == 0) {
          rVar6 = RFC5444_EMPTY_ADDRBLOCK;
          goto LAB_00115239;
        }
        uVar11 = 0;
        rVar6 = RFC5444_END_OF_BUFFER;
        pbVar12 = local_198;
        if (local_198 < local_178) {
          uVar11 = (ulong)pbVar13[1];
          pbVar12 = pbVar13 + 2;
          rVar6 = RFC5444_OKAY;
        }
        prVar8->addr[0] = '\0';
        prVar8->addr[1] = '\0';
        prVar8->addr[2] = '\0';
        prVar8->addr[3] = '\0';
        prVar8->addr[4] = '\0';
        prVar8->addr[5] = '\0';
        prVar8->addr[6] = '\0';
        prVar8->addr[7] = '\0';
        prVar8->addr[8] = '\0';
        prVar8->addr[9] = '\0';
        prVar8->addr[10] = '\0';
        prVar8->addr[0xb] = '\0';
        prVar8->addr[0xc] = '\0';
        prVar8->addr[0xd] = '\0';
        prVar8->addr[0xe] = '\0';
        prVar8->addr[0xf] = '\0';
        prVar8->mid_len = local_120.addr_len;
        bVar4 = local_120.addr_len;
        if ((char)uVar11 < '\0') {
          if ((local_198 < local_178) && (pbVar12 < local_178)) {
            bVar4 = *pbVar12;
            local_198 = pbVar12 + 1;
            prVar8->mid_start = bVar4;
            if (((byte)(bVar4 - 1) < 0xf) && (bVar4 < local_120.addr_len)) {
              pbVar12 = local_198 + bVar4;
              if (local_178 < pbVar12) {
                rVar6 = RFC5444_END_OF_BUFFER;
                pbVar18 = local_188;
                goto LAB_00115239;
              }
              local_160 = (list_entity *)CONCAT44(local_160._4_4_,(int)uVar11);
              memcpy(prVar8->addr,local_198,(ulong)bVar4);
              uVar11 = (ulong)local_160 & 0xffffffff;
              prVar8->mid_len = uVar3 - bVar4;
              rVar6 = RFC5444_OKAY;
              bVar4 = uVar3 - bVar4;
              goto LAB_00114d19;
            }
          }
          else {
            prVar8->mid_start = '\0';
            local_198 = pbVar12;
          }
          rVar6 = RFC5444_BAD_ADDR_HEAD_LENGTH;
          goto LAB_00115239;
        }
LAB_00114d19:
        local_198 = pbVar12;
        pbVar13 = local_198;
        pbVar20 = local_190;
        pbVar18 = local_188;
        switch((byte)(uVar11 >> 5) & 3) {
        case 1:
          bVar9 = 0;
          if (rVar6 == RFC5444_OKAY) {
            if (local_198 < pbVar14) {
              bVar9 = *local_198;
              local_198 = local_198 + 1;
              rVar6 = RFC5444_OKAY;
            }
            else {
              rVar6 = RFC5444_END_OF_BUFFER;
              bVar9 = 0;
            }
          }
          bVar4 = bVar4 - bVar9;
          prVar8->mid_len = bVar4;
          pbVar13 = local_198;
        case 0:
LAB_00114ddc:
          pbVar14 = local_178;
          pbVar18 = local_188;
          pbVar20 = local_190;
          prVar8->mid_src = pbVar13;
          local_198 = pbVar13 + (ulong)bVar4 * (ulong)bVar16;
          if (local_178 < local_198) {
LAB_00114eb8:
            rVar6 = RFC5444_END_OF_BUFFER;
            break;
          }
          switch((byte)(uVar11 >> 3) & 3) {
          case 0:
            prVar8->prefixlen = local_120.addr_len << 3;
            break;
          case 1:
            prVar8->prefixes = local_198;
            local_198 = local_198 + bVar16;
            break;
          case 2:
            prVar8->prefixlen = *local_198;
            local_198 = local_198 + 1;
            break;
          case 3:
            rVar6 = RFC5444_BAD_MSG_PREFIXFLAGS;
            goto LAB_00115239;
          }
          if (local_178 < local_198) goto LAB_00114eb8;
          prVar8->addr_block_size = (long)local_198 - (long)prVar8->addr_block_ptr;
          if ((rVar6 != RFC5444_OKAY) ||
             (rVar6 = _parse_tlvblock(parser,(avl_tree *)local_180,&local_198,local_178,bVar16),
             plVar17 = addr_head.prev, rVar6 != RFC5444_OKAY)) break;
          prVar8->addr_tlv_size =
               (size_t)(local_198 + (-(long)prVar8->addr_block_ptr - prVar8->addr_block_size));
          (prVar8->list_node).next = &addr_head;
          (prVar8->list_node).prev = addr_head.prev;
          addr_head.prev = &prVar8->list_node;
          plVar17->next = &prVar8->list_node;
          goto LAB_00114bef;
        case 2:
          if ((rVar6 == RFC5444_OKAY) && (local_198 < pbVar14)) {
            bVar4 = *local_198;
            local_198 = local_198 + 1;
            if (((byte)(bVar4 - 1) < 0xf) && (bVar4 < uVar3)) {
              uVar19 = (ulong)bVar4;
              pbVar13 = local_198 + uVar19;
              if (pbVar13 <= pbVar14) {
                local_160 = (list_entity *)CONCAT44(local_160._4_4_,(int)uVar11);
                memcpy(prVar8->addr + (uVar3 - uVar19),local_198,uVar19);
                uVar11 = (ulong)local_160 & 0xffffffff;
                bVar16 = prVar8->num_addr;
                bVar4 = prVar8->mid_len - bVar4;
                prVar8->mid_len = bVar4;
                rVar6 = RFC5444_OKAY;
                goto LAB_00114ddc;
              }
              rVar6 = RFC5444_END_OF_BUFFER;
              pbVar14 = local_178;
              break;
            }
          }
          rVar6 = RFC5444_BAD_ADDR_TAIL_LENGTH;
          break;
        case 3:
          rVar6 = RFC5444_BAD_MSG_TAILFLAGS;
        }
LAB_00115239:
        local_19c = rVar6;
        (*parser->free_addrblock_entry)(prVar8);
        uVar11 = local_168;
      }
      goto LAB_00115249;
    }
    if (local_198 + local_120.addr_len <= pbVar18) {
      netaddr_from_binary_prefix(&local_120.orig_addr,local_198,(ulong)local_120.addr_len,'\0',0xff)
      ;
      local_198 = pbVar14 + local_120.addr_len;
      goto LAB_00114ac8;
    }
    local_19c = RFC5444_END_OF_BUFFER;
    pbVar14 = (byte *)0x0;
LAB_00114b99:
    local_120.msg_buffer = (uint8_t *)0x0;
    prVar8 = (rfc5444_reader_addrblock_entry *)addr_head.next;
    goto LAB_00115273;
  }
  goto LAB_00115321;
LAB_00114ec1:
  local_19c = RFC5444_OKAY;
  local_120.msg_buffer = pbVar20;
  local_120.msg_size = local_168;
  first = (rfc5444_reader_tlvblock_consumer *)0x0;
  last = (rfc5444_reader_tlvblock_consumer *)0x0;
  pbVar14 = local_178;
  prVar15 = local_88;
  uVar11 = local_168;
  do {
    do {
      prVar15 = (rfc5444_reader_tlvblock_consumer *)(prVar15->_node).list.next;
      if ((prVar15->_node).list.prev == (parser->message_consumer).list_head.prev) {
        rVar6 = RFC5444_OKAY;
        goto LAB_001151d9;
      }
    } while ((prVar15->default_msg_consumer == false) && (prVar15->msg_id != local_120.msg_type));
    local_180 = prVar15;
    if (first == (rfc5444_reader_tlvblock_consumer *)0x0) {
      first = (rfc5444_reader_tlvblock_consumer *)0x0;
    }
    else if (last->order < prVar15->order) {
      rVar6 = schedule_end_message_cbs(&local_120,first,last,RFC5444_OKAY);
      local_19c = rVar6;
      if (rVar6 != RFC5444_OKAY) goto LAB_00115249;
      first = (rfc5444_reader_tlvblock_consumer *)0x0;
      local_19c = RFC5444_OKAY;
    }
    if (local_180->addrblock_consumer == true) {
      local_120.type = RFC5444_CONTEXT_ADDRESS;
      plVar17 = &addr_head;
      prVar15 = local_180;
      while (plVar17 = plVar17->next, plVar17->prev != addr_head.prev) {
        local_120.addr_block_buffer = (uint8_t *)plVar17[6].prev;
        local_120.addr_block_size = (size_t)plVar17[7].next;
        local_120.addr_tlv_size = (size_t)plVar17[7].prev;
        local_160 = plVar17 + 5;
        for (uVar19 = 0; binary = local_160, uVar11 = local_168, uVar19 < *(byte *)&plVar17[3].prev;
            uVar19 = uVar19 + 1) {
          bVar16 = (byte)uVar19;
          if (((ulong)(&plVar17[8].next)[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
            uVar11 = (ulong)*(byte *)((long)&plVar17[3].prev + 2);
            memcpy((void *)((long)&local_160->next + (ulong)*(byte *)((long)&plVar17[3].prev + 1)),
                   (list_entity **)((long)&(plVar17[4].prev)->next + uVar19 * uVar11),uVar11);
            plVar10 = (list_entity *)((long)&(plVar17[4].next)->next + uVar19);
            if (plVar17[4].next == (list_entity *)0x0) {
              plVar10 = plVar17 + 6;
            }
            netaddr_from_binary_prefix
                      (&local_120.addr,binary,(ulong)local_120.addr_len,'\0',
                       *(uint8_t *)&plVar10->next);
            local_120.addr_index = bVar16;
            if (local_180->start_callback ==
                (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) {
LAB_00115085:
              rVar6 = _schedule_tlvblock(local_180,&local_120,(avl_tree *)(plVar17 + 1),bVar16);
            }
            else {
              local_120.consumer = local_180;
              rVar6 = (*local_180->start_callback)(&local_120);
              if (rVar6 == RFC5444_OKAY) goto LAB_00115085;
            }
            if (local_180->end_callback !=
                (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) {
              local_120.consumer = local_180;
              rVar7 = (*local_180->end_callback)(&local_120,rVar6 != RFC5444_OKAY);
              if (rVar6 < rVar7) {
                rVar6 = rVar7;
              }
            }
            prVar15 = local_180;
            if (rVar6 != RFC5444_OKAY) {
              pbVar14 = local_178;
              pbVar18 = local_188;
              uVar11 = local_168;
              pbVar20 = local_190;
              if (rVar6 != RFC5444_DROP_ADDRESS) goto LAB_001151a0;
              (&plVar17[8].next)[uVar19 >> 6] =
                   (list_entity *)((ulong)(&plVar17[8].next)[uVar19 >> 6] | 1L << (bVar16 & 0x3f));
            }
          }
          pbVar14 = local_178;
          pbVar20 = local_190;
        }
      }
      local_120.addr_block_buffer = (uint8_t *)0x0;
      pbVar18 = local_188;
      rVar6 = RFC5444_OKAY;
    }
    else {
      local_120.type = RFC5444_CONTEXT_MESSAGE;
      if ((local_180->start_callback ==
           (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) ||
         (local_120.consumer = local_180, rVar6 = (*local_180->start_callback)(&local_120),
         rVar6 == RFC5444_OKAY)) {
        rVar6 = _schedule_tlvblock(local_180,&local_120,&tlv_entries,'\0');
      }
      last = local_180;
      prVar15 = local_180;
      if (first == (rfc5444_reader_tlvblock_consumer *)0x0) {
        first = local_180;
      }
    }
LAB_001151a0:
    local_19c = rVar6;
    rVar6 = local_19c;
  } while (local_19c == RFC5444_OKAY);
LAB_001151d9:
  if (first != (rfc5444_reader_tlvblock_consumer *)0x0) {
    rVar6 = schedule_end_message_cbs(&local_120,first,last,rVar6);
    local_19c = rVar6;
  }
LAB_00115249:
  local_120.msg_buffer = (uint8_t *)0x0;
  prVar8 = (rfc5444_reader_addrblock_entry *)addr_head.next;
  if ((((rVar6 == RFC5444_DROP_MSG_BUT_FORWARD) || (rVar6 == RFC5444_OKAY)) &&
      (local_120._do_not_forward == false)) &&
     (((parser->forward_message !=
        (_func_void_rfc5444_reader_tlvblock_context_ptr_uint8_t_ptr_size_t *)0x0 &&
       (local_120.has_hoplimit == true)) && (1 < local_120.hoplimit)))) {
    local_120.type = RFC5444_CONTEXT_MESSAGE;
    (*parser->forward_message)(&local_120,pbVar20,uVar11);
    prVar8 = (rfc5444_reader_addrblock_entry *)addr_head.next;
  }
LAB_00115273:
  while ((prVar8->list_node).prev != addr_head.prev) {
    prVar1 = (rfc5444_reader_addrblock_entry *)(prVar8->list_node).next;
    _free_tlvblock(parser,&prVar8->tlvblock);
    (*parser->free_addrblock_entry)(prVar8);
    prVar8 = prVar1;
  }
  _free_tlvblock(parser,&tlv_entries);
  local_16c = local_19c >> 0x1f & local_19c;
  local_198 = pbVar14;
  if (local_19c == RFC5444_DROP_PACKET) {
    local_16c = RFC5444_DROP_PACKET;
  }
  goto LAB_001149c5;
}

Assistant:

enum rfc5444_result
rfc5444_reader_handle_packet(struct rfc5444_reader *parser, const uint8_t *buffer, size_t length)
{
  struct rfc5444_reader_tlvblock_context context;
  struct avl_tree entries;
  struct rfc5444_reader_tlvblock_consumer *consumer, *last_started;
  const uint8_t *ptr, *eob;
  bool has_tlv;
  uint8_t first_byte;
  enum rfc5444_result result = RFC5444_OKAY;

  if (length > 65535) {
    return RFC5444_TOO_LARGE;
  }

  /* copy pointer to prevent writing over parameter */
  ptr = buffer;
  eob = buffer + length;

  /* initialize tlv context */
  memset(&context, 0, sizeof(context));
  context.type = RFC5444_CONTEXT_PACKET;
  context.reader = parser;

  /* read header of packet */
  first_byte = _rfc5444_get_u8(&ptr, eob, &result);
  context.pkt_version = rfc5444_get_pktversion(first_byte);
  context.pkt_flags = first_byte & RFC5444_PKT_FLAGMASK;

  if (context.pkt_version != 0) {
    /*
     * bad packet version, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return RFC5444_UNSUPPORTED_VERSION;
  }

  /* check for sequence number */
  context.has_pktseqno = ((context.pkt_flags & RFC5444_PKT_FLAG_SEQNO) != 0);
  if (context.has_pktseqno) {
    context.pkt_seqno = _rfc5444_get_u16(&ptr, eob, &result);
  }

  if (result != RFC5444_OKAY) {
    /*
     * error during parsing, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return result;
  }

  /* initialize avl_tree */
  avl_init(&entries, avl_comp_uint32, true);
  last_started = NULL;

  /* check for packet tlv */
  has_tlv = (context.pkt_flags & RFC5444_PKT_FLAG_TLV) != 0;
  if (has_tlv) {
    result = _parse_tlvblock(parser, &entries, &ptr, eob, 0);
    if (result != RFC5444_OKAY) {
      /*
       * error while parsing TLV block, do not jump to cleanup_parse packet because
       * we have not allocated any resources at this point
       */
      return result;
    }
  }

  /* update packet buffer pointer */
  context.pkt_buffer = buffer;
  context.pkt_size = length;

  /* handle packet consumers, call start callbacks */
  avl_for_each_element(&parser->packet_consumer, consumer, _node) {
    last_started = consumer;
    /* this one can drop a packet */
    if (consumer->start_callback != NULL) {
      context.consumer = consumer;
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        consumer->start_callback(&context);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
    /* handle packet tlv consumers */
    if (has_tlv && (consumer->tlv_callback != NULL || consumer->block_callback != NULL)) {
      /* can drop packet */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        _schedule_tlvblock(consumer, &context, &entries, 0);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
  }

  /* parse messages */
  while (result == RFC5444_OKAY && ptr < eob) {
    /* can drop packet (need to be there for error handling too) */
    result = _handle_message(parser, &context, &ptr, eob);
  }

#if DISALLOW_CONSUMER_CONTEXT_DROP == false
cleanup_parse_packet:
#endif
  /* call end-of-context callback */
  if (!avl_is_empty(&parser->packet_consumer)) {
    avl_for_first_to_element_reverse(&parser->packet_consumer, last_started, consumer, _node) {
      if (consumer->end_callback) {
        context.consumer = consumer;
        consumer->end_callback(&context, result != RFC5444_OKAY);
      }
    }
  }
  _free_tlvblock(parser, &entries);

  /* do not tell caller about packet drop */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
  if (result == RFC5444_DROP_PACKET) {
    return RFC5444_OKAY;
  }
#endif
  return result;
}